

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseSnapshot.cpp
# Opt level: O3

void __thiscall
DatabaseSnapshot::force_index_files
          (DatabaseSnapshot *this,Task *task,vector<IndexType,_std::allocator<IndexType>_> *types,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *taints,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *targets)

{
  atomic_uint64_t *paVar1;
  vector<DBChange,_std::allocator<DBChange>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  OnDiskDataset *this_01;
  source_loc loc;
  _Rep_type *p_Var3;
  pointer ppOVar4;
  logger *this_02;
  string *obj_name;
  _Rb_tree_node_base *p_Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *target;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  string_view_t fmt;
  Indexer indexer;
  DbChangeType local_1fc;
  string local_1f8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1d0;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> local_1c8;
  Task *local_1b0;
  pointer local_1a8;
  pointer local_1a0;
  DBChange local_198;
  DBChange local_150;
  Indexer local_108;
  int __c;
  
  if ((targets->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (targets->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_1d0 = taints;
    Indexer::Indexer(&local_108,this,types);
    LOCK();
    (task->spec_->work_estimated_).super___atomic_base<unsigned_long>._M_i =
         ((long)(targets->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(targets->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5) + 1;
    UNLOCK();
    args = (targets->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (targets->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (args != pbVar2) {
      do {
        this_02 = spdlog::default_logger_raw();
        local_1f8._M_dataplus._M_p = (pointer)0x0;
        local_1f8._M_string_length = 0;
        local_1f8.field_2._M_allocated_capacity = 0;
        loc.funcname = (char *)0x0;
        loc.filename = (char *)0x0;
        loc.line = 0;
        loc._12_4_ = 0;
        fmt.size_ = 0xb;
        fmt.data_ = "Indexing {}";
        spdlog::logger::log<std::__cxx11::string>(this_02,loc,debug,fmt,args);
        Indexer::index(&local_108,(char *)args,__c);
        LOCK();
        paVar1 = &task->spec_->work_done_;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
        UNLOCK();
        args = args + 1;
      } while (args != pbVar2);
    }
    Indexer::finalize(&local_1c8,&local_108);
    local_1a8 = local_1c8.
                super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    ppOVar4 = local_1a0;
    if (local_1c8.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_1c8.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      this_00 = &task->changes_;
      p_Var3 = &local_1d0->_M_t;
      local_1a0 = local_1c8.
                  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      local_1b0 = task;
      do {
        this_01 = *local_1a0;
        local_1fc = Insert;
        obj_name = OnDiskDataset::get_name_abi_cxx11_(this_01);
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
        DBChange::DBChange(&local_198,&local_1fc,obj_name,&local_1f8);
        std::vector<DBChange,_std::allocator<DBChange>_>::emplace_back<DBChange>(this_00,&local_198)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198.parameter._M_dataplus._M_p != &local_198.parameter.field_2) {
          operator_delete(local_198.parameter._M_dataplus._M_p,
                          local_198.parameter.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198.obj_name._M_dataplus._M_p != &local_198.obj_name.field_2) {
          operator_delete(local_198.obj_name._M_dataplus._M_p,
                          local_198.obj_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        p_Var5 = (local_1d0->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        task = local_1b0;
        ppOVar4 = local_1a0;
        while (local_1b0 = task,
              (_Rb_tree_header *)p_Var5 != &(p_Var3->_M_impl).super__Rb_tree_header) {
          local_1fc = ToggleTaint;
          local_1a0 = ppOVar4;
          OnDiskDataset::get_id_abi_cxx11_(&local_1f8,this_01);
          DBChange::DBChange(&local_150,&local_1fc,&local_1f8,(string *)(p_Var5 + 1));
          std::vector<DBChange,_std::allocator<DBChange>_>::emplace_back<DBChange>
                    (this_00,&local_150);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150.parameter._M_dataplus._M_p != &local_150.parameter.field_2) {
            operator_delete(local_150.parameter._M_dataplus._M_p,
                            local_150.parameter.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150.obj_name._M_dataplus._M_p != &local_150.obj_name.field_2) {
            operator_delete(local_150.obj_name._M_dataplus._M_p,
                            local_150.obj_name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
          task = local_1b0;
          ppOVar4 = local_1a0;
        }
        local_1a0 = ppOVar4 + 1;
      } while (local_1a0 != local_1a8);
    }
    local_1a0 = ppOVar4;
    if (local_1c8.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1c8.
                      super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1c8.
                            super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c8.
                            super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    LOCK();
    paVar1 = &task->spec_->work_done_;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    Indexer::~Indexer(&local_108);
  }
  return;
}

Assistant:

void DatabaseSnapshot::force_index_files(
    Task *task, const std::vector<IndexType> &types,
    const std::set<std::string> &taints,
    const std::vector<std::string> &targets) const {
    if (targets.empty()) {
        return;
    }

    Indexer indexer(this, types);

    task->spec().estimate_work(targets.size() + 1);

    for (const auto &target : targets) {
        spdlog::debug("Indexing {}", target);
        indexer.index(target);
        task->spec().add_progress(1);
    }

    for (const auto *ds : indexer.finalize()) {
        task->change(DBChange(DbChangeType::Insert, ds->get_name()));
        for (const auto &taint : taints) {
            task->change(
                DBChange(DbChangeType::ToggleTaint, ds->get_id(), taint));
        }
    }

    task->spec().add_progress(1);
}